

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O3

bool Diligent::PSOSerializer<(Diligent::SerializerMode)2>::SerializeCreateInfo
               (Serializer<(Diligent::SerializerMode)2> *Ser,
               ConstQual<PipelineStateCreateInfo> *CreateInfo,ConstQual<TPRSNames> *PRSNames,
               DynamicLinearAllocator *Allocator)

{
  bool bVar1;
  TEnableStr<const_char_*> TVar2;
  ulong uVar3;
  
  bVar1 = Serializer<(Diligent::SerializerMode)2>::Copy<Diligent::PIPELINE_TYPE_const>
                    (Ser,&(CreateInfo->PSODesc).PipelineType,1);
  if (bVar1) {
    bVar1 = Serializer<(Diligent::SerializerMode)2>::operator()
                      (Ser,&CreateInfo->ResourceSignaturesCount,&CreateInfo->Flags);
    if ((((bVar1) &&
         (bVar1 = Serializer<(Diligent::SerializerMode)2>::operator()
                            (Ser,&(CreateInfo->PSODesc).ResourceLayout.DefaultVariableType,
                             &(CreateInfo->PSODesc).ResourceLayout.DefaultVariableMergeStages),
         bVar1)) &&
        (bVar1 = Serializer<(Diligent::SerializerMode)2>::
                 SerializeArray<Diligent::ShaderResourceVariableDesc_const*const,unsigned_int_const,Diligent::PSOSerializer<(Diligent::SerializerMode)2>::SerializeCreateInfo(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::PipelineStateCreateInfo_const&,std::array<char_const*,8ul>const&,Diligent::DynamicLinearAllocator*)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::ShaderResourceVariableDesc_const&)_1_>
                           (Ser,Allocator,&(CreateInfo->PSODesc).ResourceLayout.Variables,
                            &(CreateInfo->PSODesc).ResourceLayout.NumVariables), bVar1)) &&
       (bVar1 = Serializer<(Diligent::SerializerMode)2>::
                SerializeArray<Diligent::ImmutableSamplerDesc_const*const,unsigned_int_const,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::ImmutableSamplerDesc_const&)>
                          (Ser,Allocator,&(CreateInfo->PSODesc).ResourceLayout.ImmutableSamplers,
                           &(CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers,
                           SerializeImmutableSampler<(Diligent::SerializerMode)2>), bVar1)) {
      uVar3 = 0;
      do {
        TVar2 = Serializer<(Diligent::SerializerMode)2>::Serialize<char_const*>
                          (Ser,PRSNames->_M_elems[uVar3]);
        if (!TVar2) {
          return TVar2;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < CreateInfo->ResourceSignaturesCount);
      return TVar2;
    }
  }
  return false;
}

Assistant:

bool PSOSerializer<Mode>::SerializeCreateInfo(
    Serializer<Mode>&                   Ser,
    ConstQual<PipelineStateCreateInfo>& CreateInfo,
    ConstQual<TPRSNames>&               PRSNames,
    DynamicLinearAllocator*             Allocator)
{
    // Serialize PipelineStateCreateInfo
    // Serialize PipelineStateDesc
    if (!Ser(CreateInfo.PSODesc.PipelineType))
        return false;

    if (!Ser(CreateInfo.ResourceSignaturesCount,
             CreateInfo.Flags))
        return false;
    // skip SRBAllocationGranularity
    // skip ImmediateContextMask
    // skip pPSOCache

    auto& ResourceLayout = CreateInfo.PSODesc.ResourceLayout;
    if (!Ser(ResourceLayout.DefaultVariableType, ResourceLayout.DefaultVariableMergeStages))
        return false;

    if (!Ser.SerializeArray(Allocator, ResourceLayout.Variables, ResourceLayout.NumVariables,
                            [](Serializer<Mode>&                      Ser,
                               ConstQual<ShaderResourceVariableDesc>& VarDesc) //
                            {
                                return Ser(VarDesc.Name,
                                           VarDesc.ShaderStages,
                                           VarDesc.Type,
                                           VarDesc.Flags);
                            }))
        return false;

    if (!Ser.SerializeArray(Allocator, ResourceLayout.ImmutableSamplers, ResourceLayout.NumImmutableSamplers, SerializeImmutableSampler<Mode>))
        return false;

    // Instead of ppResourceSignatures
    for (Uint32 i = 0; i < std::max(CreateInfo.ResourceSignaturesCount, 1u); ++i)
    {
        if (!Ser(PRSNames[i]))
            return false;
    }

    ASSERT_SIZEOF64(ShaderResourceVariableDesc, 16, "Did you add a new member to ShaderResourceVariableDesc? Please add serialization here.");
    ASSERT_SIZEOF64(PipelineStateCreateInfo, 96, "Did you add a new member to PipelineStateCreateInfo? Please add serialization here.");

    return true;
}